

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

int setnonblocking(int sfd)

{
  uint uVar1;
  int iVar2;
  int flags;
  int sfd_local;
  
  uVar1 = fcntl(sfd,3,0);
  if (uVar1 == 0xffffffff) {
    WriteLogPError("fcntl()");
    flags = -1;
  }
  else {
    iVar2 = fcntl(sfd,4,(ulong)(uVar1 | 0x800));
    if (iVar2 == -1) {
      WriteLogPError("fcntl()");
      flags = -1;
    }
    else {
      flags = 0;
    }
  }
  return flags;
}

Assistant:

int setnonblocking (int sfd)
{
  int flags;
  if((flags = fcntl (sfd, F_GETFL, 0)) == -1)
    {
      WriteLogPError("fcntl()");
      return -1;
    }

  flags |= O_NONBLOCK;
  if((fcntl (sfd, F_SETFL, flags)) == -1)
    {
      WriteLogPError("fcntl()");
      return -1;
    }

  return 0;
}